

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_bspline_span_index
          (REF_INT degree,REF_INT n_control_point,REF_DBL *knots,REF_DBL t,REF_INT *span)

{
  bool bVar1;
  int local_3c;
  REF_INT n;
  REF_INT mid;
  REF_INT high;
  REF_INT low;
  REF_INT *span_local;
  REF_DBL t_local;
  REF_DBL *knots_local;
  REF_INT n_control_point_local;
  REF_INT degree_local;
  
  *span = -1;
  if (t < knots[n_control_point]) {
    if (knots[degree] < t) {
      local_3c = degree + n_control_point;
      n = n_control_point;
      mid = degree;
      while( true ) {
        local_3c = local_3c / 2;
        if ((t < knots[local_3c]) || (bVar1 = false, knots[local_3c + 1] <= t)) {
          bVar1 = mid != n;
        }
        if (!bVar1) break;
        if (knots[local_3c] <= t) {
          mid = local_3c;
        }
        else {
          n = local_3c;
        }
        local_3c = mid + n;
      }
      *span = local_3c;
    }
    else {
      *span = degree;
    }
  }
  else {
    *span = n_control_point + -1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_span_index(REF_INT degree,
                                               REF_INT n_control_point,
                                               REF_DBL *knots, REF_DBL t,
                                               REF_INT *span) {
  REF_INT low, high, mid;
  REF_INT n = ref_geom_bspline_n(degree, n_control_point);
  *span = REF_EMPTY;
  if (t >= knots[n + 1]) {
    *span = n;
    return REF_SUCCESS;
  }
  if (t <= knots[degree]) {
    *span = degree;
    return REF_SUCCESS;
  }
  low = degree;
  high = n + 1;
  mid = (low + high) / 2;
  while ((t < knots[mid] || t >= knots[mid + 1]) && (low != high)) {
    /* printf("t %f l %d m %d h %d\n",t,low,mid,high); */
    if (t < knots[mid]) {
      high = mid;
    } else {
      low = mid;
    }
    mid = (low + high) / 2;
  }
  *span = mid;
  return REF_SUCCESS;
}